

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parse.cpp
# Opt level: O2

ParseNodeObjLit * __thiscall
Parser::CreateObjectPatternNode
          (Parser *this,ParseNodePtr pnodeMemberList,charcount_t ichMin,charcount_t ichLim,
          bool convertToPattern)

{
  OpCode OVar1;
  ParseNode *this_00;
  code *pcVar2;
  bool bVar3;
  undefined4 *puVar4;
  ParseNodeBin *pPVar5;
  ParseNodeType *pPVar6;
  undefined3 in_register_00000081;
  ParseNodePtr *item;
  anon_class_48_6_2b1b69a8 local_88;
  anon_class_8_1_aca58a2a local_58;
  ParseNodePtr local_50;
  ParseNodePtr local_48;
  ParseNodePtr pnodeMemberNodeList;
  uint local_38;
  uint32 staticCount;
  uint32 computedCount;
  bool convertToPattern_local;
  bool hasRest;
  
  pnodeMemberNodeList._4_4_ = 0;
  local_38 = 0;
  staticCount._2_1_ = convertToPattern;
  staticCount._3_1_ = 0;
  local_48 = (ParseNodePtr)0x0;
  if (CONCAT31(in_register_00000081,convertToPattern) == 0) {
    local_48 = pnodeMemberList;
  }
  if (pnodeMemberList != (ParseNodePtr)0x0) {
    OVar1 = pnodeMemberList->nop;
    if (((OVar1 != knopList && !convertToPattern) && (OVar1 != knopEllipsis)) &&
       (OVar1 != knopObjectPatternMember)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
      *puVar4 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp"
                         ,0x4c4,
                         "(pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis)"
                         ,
                         "pnodeMemberList->nop == knopList || (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || convertToPattern || pnodeMemberList->nop == knopEllipsis"
                        );
      if (!bVar3) {
        pcVar2 = (code *)invalidInstructionException();
        (*pcVar2)();
      }
      *puVar4 = 0;
    }
    local_88.convertToPattern = (bool *)((long)&staticCount + 2);
    local_58.handler = &local_88;
    local_88.pnodeMemberNodeList = &local_48;
    local_88.computedCount = &local_38;
    local_88.staticCount = (uint32 *)((long)&pnodeMemberNodeList + 4);
    local_88.hasRest = (bool *)((long)&staticCount + 3);
    item = &local_50;
    local_50 = pnodeMemberList;
    local_88.this = this;
    while ((item != (ParseNodePtr *)0x0 && (this_00 = *item, this_00 != (ParseNode *)0x0))) {
      if (this_00->nop == knopList) {
        pPVar5 = ParseNode::AsParseNodeBin(this_00);
        ForEachItemInList<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp:1221:44)>
        ::anon_class_8_1_aca58a2a::operator()(&local_58,&pPVar5->pnode1);
        pPVar5 = ParseNode::AsParseNodeBin(*item);
        item = &pPVar5->pnode2;
      }
      else {
        ForEachItemInList<(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Parser/Parse.cpp:1221:44)>
        ::anon_class_8_1_aca58a2a::operator()(&local_58,item);
        item = (ParseNodePtr *)0x0;
      }
    }
  }
  pPVar6 = CreateNodeForOpT<(OpCode)112>(this,ichMin,ichLim);
  (pPVar6->super_ParseNodeUni).pnode1 = local_48;
  pPVar6->computedCount = local_38;
  pPVar6->staticCount = pnodeMemberNodeList._4_4_;
  pPVar6->hasRest = (bool)staticCount._3_1_;
  return pPVar6;
}

Assistant:

ParseNodeObjLit * Parser::CreateObjectPatternNode(ParseNodePtr pnodeMemberList, charcount_t ichMin, charcount_t ichLim, bool convertToPattern) {
    // Count the number of non-rest members in the object
    uint32 staticCount = 0;
    uint32 computedCount = 0;
    bool hasRest = false;
    ParseNodePtr pnodeMemberNodeList = convertToPattern ? nullptr : pnodeMemberList;
    if (pnodeMemberList != nullptr)
    {
        Assert(pnodeMemberList->nop == knopList || 
              (!convertToPattern && pnodeMemberList->nop == knopObjectPatternMember) || 
              convertToPattern ||
              pnodeMemberList->nop == knopEllipsis);
        ForEachItemInList(pnodeMemberList, [&](ParseNodePtr item) {
            ParseNodePtr memberNode = convertToPattern ? ConvertMemberToMemberPattern(item) : item;
            if (convertToPattern)
            {
                AppendToList(&pnodeMemberNodeList, memberNode);
            }
            if (memberNode->nop != knopEllipsis)
            {
                ParseNodePtr nameNode = memberNode->AsParseNodeBin()->pnode1;
                Assert(nameNode->nop == knopComputedName || nameNode->nop == knopStr);
                if (nameNode->nop == knopComputedName)
                {
                    computedCount++;
                }
                else
                {
                    staticCount++;
                }
            }
            else
            {
                hasRest = true;
            }
        });
    }

    ParseNodeObjLit * objectPatternNode = CreateNodeForOpT<knopObjectPattern>(ichMin, ichLim);
    objectPatternNode->pnode1 = pnodeMemberNodeList;
    objectPatternNode->computedCount = computedCount;
    objectPatternNode->staticCount = staticCount;
    objectPatternNode->hasRest = hasRest;
    return objectPatternNode;
}